

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfTiledInputFile * ImfOpenTiledInputFile(char *name)

{
  ImfTiledInputFile *pIVar1;
  exception *e;
  int in_stack_00000094;
  char *in_stack_00000098;
  TiledRgbaInputFile *in_stack_000000a0;
  
  pIVar1 = (ImfTiledInputFile *)operator_new(0x38);
  Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
            (in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  return pIVar1;
}

Assistant:

ImfTiledInputFile*
ImfOpenTiledInputFile (const char name[])
{
    try
    {
        return (ImfTiledInputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            TiledRgbaInputFile (name);
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}